

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool *pbVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  undefined8 uVar8;
  char *pcVar9;
  bool bVar10;
  int iVar11;
  bool *__dest;
  undefined8 extraout_RAX;
  pointer pp_Var12;
  TemplateDictionaryPeer peer;
  string dump;
  size_type __dnew;
  TemplateDictionary dict;
  undefined1 local_1a8 [16];
  char *local_198;
  TemplateId local_190;
  TemplateDictionaryPeer local_188;
  TemplateString local_180;
  char *local_160;
  undefined8 local_158;
  char local_150 [16];
  bool *local_140;
  undefined8 uStack_138;
  char local_130;
  undefined2 uStack_12f;
  undefined4 uStack_12d;
  undefined1 uStack_129;
  undefined8 uStack_128;
  TemplateString local_120;
  bool *local_100;
  undefined8 uStack_f8;
  undefined1 local_f0;
  uint7 uStack_ef;
  undefined8 uStack_e8;
  bool *local_e0;
  undefined8 uStack_d8;
  undefined1 local_d0;
  uint7 uStack_cf;
  undefined8 uStack_c8;
  TemplateString local_c0;
  char *local_a0;
  undefined8 uStack_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  
  local_a0 = "GLOBAL";
  uStack_98 = 6;
  local_90 = 1;
  uStack_88 = 0;
  local_120.ptr_ = "top";
  local_120.length_ = 3;
  local_120.is_immutable_ = true;
  local_120.id_ = 0;
  TVar5._17_7_ = local_120._17_7_;
  TVar5.is_immutable_ = true;
  TVar2._17_7_ = uStack_8f;
  TVar2.is_immutable_ = true;
  TVar2.length_ = 6;
  TVar2.ptr_ = "GLOBAL";
  TVar2.id_ = 0;
  TVar5.length_ = 3;
  TVar5.ptr_ = "top";
  TVar5.id_ = 0;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar2,TVar5);
  pp_Var12 = g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_start !=
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      (**pp_Var12)();
      pp_Var12 = pp_Var12 + 1;
    } while (pp_Var12 !=
             g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  fprintf(_stderr,"\nPassed %d tests\n\nPASS\n",
          (ulong)((long)pp_Var12 -
                 (long)g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  local_120.ptr_ = "test_SetValueWithNUL";
  local_120.length_ = 0x14;
  local_120.is_immutable_ = true;
  local_120.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)&local_a0,&local_120,(UnsafeArena *)0x0);
  local_130 = 'F';
  uStack_12f = 0x4f4f;
  uStack_12d = 0x52414200;
  uStack_138 = 7;
  uStack_129 = 0;
  local_120.length_ = 7;
  local_120.is_immutable_ = false;
  local_120.id_ = 0;
  pbVar1 = &local_180.is_immutable_;
  local_180.is_immutable_ = true;
  local_180._17_7_ = 0x58555551005855;
  local_180.length_ = 8;
  local_180.id_ = local_180.id_ & 0xffffffffffffff00;
  uStack_d8 = 8;
  local_d0 = 0;
  uStack_c8 = 0;
  TVar3.length_ = 7;
  TVar3.ptr_ = &local_130;
  TVar3._16_8_ = (ulong)(uint7)local_120._17_7_ << 8;
  TVar3.id_ = 0;
  TVar6.length_ = 8;
  TVar6.ptr_ = pbVar1;
  TVar6._16_8_ = (ulong)uStack_cf << 8;
  TVar6.id_ = 0;
  local_188.dict_ = (TemplateDictionary *)&local_a0;
  local_180.ptr_ = pbVar1;
  local_140 = (bool *)&local_130;
  local_120.ptr_ = &local_130;
  local_e0 = pbVar1;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar6);
  if ((bool *)local_180.ptr_ != pbVar1) {
    operator_delete(local_180.ptr_);
  }
  if (local_140 != (bool *)&local_130) {
    operator_delete(local_140);
  }
  local_180.length_ = 7;
  local_180.is_immutable_ = true;
  local_180._17_7_ = 0x524147004f4f;
  uStack_138 = 7;
  local_130 = '\0';
  uStack_128 = 0;
  local_198 = (char *)0x5855554700585547;
  local_1a8._8_8_ = 8;
  local_190 = local_190 & 0xffffffffffffff00;
  uStack_f8 = 8;
  local_f0 = 0;
  uStack_e8 = 0;
  TVar4.length_ = 7;
  TVar4.ptr_ = pbVar1;
  TVar4._16_8_ = (ulong)CONCAT16(uStack_129,CONCAT42(uStack_12d,uStack_12f)) << 8;
  TVar4.id_ = 0;
  TVar7.length_ = 8;
  TVar7.ptr_ = (char *)&local_198;
  TVar7._16_8_ = (ulong)uStack_ef << 8;
  TVar7.id_ = 0;
  local_1a8._0_8_ = &local_198;
  local_180.ptr_ = pbVar1;
  local_140 = pbVar1;
  local_100 = (bool *)&local_198;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar4,TVar7);
  if ((char **)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if ((bool *)local_180.ptr_ != pbVar1) {
    operator_delete(local_180.ptr_);
  }
  local_180.ptr_ = "FOO";
  local_180.length_ = 3;
  local_180.is_immutable_ = true;
  local_180.id_ = 0;
  local_1a8._0_8_ = "";
  local_1a8._8_8_ = (char *)0x0;
  local_198 = (char *)CONCAT71(local_198._1_7_,1);
  local_190 = 0;
  bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs
                     (&local_188,&local_180,(TemplateString *)local_1a8);
  if (bVar10) {
    local_180.ptr_ = "GOO";
    local_180.length_ = 3;
    local_180.is_immutable_ = true;
    local_180.id_ = 0;
    local_1a8._0_8_ = "";
    local_1a8._8_8_ = (char *)0x0;
    local_198 = (char *)CONCAT71(local_198._1_7_,1);
    local_190 = 0;
    bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs
                       (&local_188,&local_180,(TemplateString *)local_1a8);
    if (!bVar10) goto LAB_0010a33b;
    local_1a8._8_8_ = (char *)0x7;
    local_198 = (char *)0x524142004f4f46;
    local_180.length_ = 7;
    local_180.is_immutable_ = false;
    local_180.id_ = 0;
    builtin_strncpy(local_150,"QUX",4);
    builtin_strncpy(local_150 + 4,"QUUX",5);
    local_158 = 8;
    local_c0.length_ = 8;
    local_c0.is_immutable_ = false;
    local_c0.id_ = 0;
    local_1a8._0_8_ = &local_198;
    local_180.ptr_ = (char *)&local_198;
    local_160 = local_150;
    local_c0.ptr_ = local_150;
    bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_188,&local_180,&local_c0);
    if (local_160 != local_150) {
      operator_delete(local_160);
    }
    if ((char **)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (bVar10) {
      local_1a8._8_8_ = (char *)0x7;
      local_198 = (char *)0x524147004f4f47;
      local_180.length_ = 7;
      local_180.is_immutable_ = false;
      local_180.id_ = 0;
      builtin_strncpy(local_150,"GUX",4);
      builtin_strncpy(local_150 + 4,"GUUX",5);
      local_158 = 8;
      local_c0.length_ = 8;
      local_c0.is_immutable_ = false;
      local_c0.id_ = 0;
      local_1a8._0_8_ = &local_198;
      local_180.ptr_ = (char *)&local_198;
      local_160 = local_150;
      local_c0.ptr_ = local_150;
      bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_188,&local_180,&local_c0);
      if (local_160 != local_150) {
        operator_delete(local_160);
      }
      if ((char **)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if (!bVar10) goto LAB_0010a345;
      local_180.length_ = 0;
      local_180.is_immutable_ = false;
      local_180.ptr_ = pbVar1;
      ctemplate::TemplateDictionary::DumpToString((string *)&local_a0,(int)&local_180);
      local_c0.ptr_ = (char *)0xa0;
      local_1a8._0_8_ = &local_198;
      __dest = (bool *)std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_c0);
      pcVar9 = local_c0.ptr_;
      local_198 = local_c0.ptr_;
      local_1a8._0_8_ = __dest;
      memcpy(__dest,
             "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n   GOO",
             0xa0);
      uVar8 = local_1a8._0_8_;
      local_1a8._8_8_ = pcVar9;
      __dest[(long)pcVar9] = false;
      if (((char *)local_180.length_ == pcVar9) &&
         (((char *)local_180.length_ == (char *)0x0 ||
          (iVar11 = bcmp(local_180.ptr_,(void *)local_1a8._0_8_,local_180.length_), iVar11 == 0))))
      {
        if ((char **)uVar8 != &local_198) {
          operator_delete((void *)uVar8);
        }
        if ((bool *)local_180.ptr_ != pbVar1) {
          operator_delete(local_180.ptr_);
        }
        ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)&local_a0);
        return 0;
      }
      main_cold_5();
      goto LAB_0010a336;
    }
  }
  else {
LAB_0010a336:
    main_cold_1();
LAB_0010a33b:
    main_cold_2();
  }
  main_cold_3();
LAB_0010a345:
  main_cold_4();
  if ((bool *)local_180.ptr_ != pbVar1) {
    operator_delete(local_180.ptr_);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)&local_a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char** argv) {

  SetUp();

  const int retval = RUN_ALL_TESTS();

  // This has to run last, so we run it manually
  TestSetValueWithNUL();

  return retval;
}